

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setPushConstantRanges
          (ShaderRenderCaseInstance *this,deUint32 rangeCount,VkPushConstantRange *pcRanges)

{
  pointer *ppVVar1;
  pointer pVVar2;
  iterator __position;
  deUint32 dVar3;
  ulong uVar4;
  
  pVVar2 = (this->m_pushConstantRanges).
           super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_pushConstantRanges).
      super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar2) {
    (this->m_pushConstantRanges).
    super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  if (rangeCount != 0) {
    uVar4 = (ulong)rangeCount;
    do {
      __position._M_current =
           (this->m_pushConstantRanges).
           super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_pushConstantRanges).
          super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>>::
        _M_realloc_insert<vk::VkPushConstantRange_const&>
                  ((vector<vk::VkPushConstantRange,std::allocator<vk::VkPushConstantRange>> *)
                   &this->m_pushConstantRanges,__position,pcRanges);
      }
      else {
        (__position._M_current)->size = pcRanges->size;
        dVar3 = pcRanges->offset;
        (__position._M_current)->stageFlags = pcRanges->stageFlags;
        (__position._M_current)->offset = dVar3;
        ppVVar1 = &(this->m_pushConstantRanges).
                   super__Vector_base<vk::VkPushConstantRange,_std::allocator<vk::VkPushConstantRange>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      pcRanges = pcRanges + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setPushConstantRanges (const deUint32 rangeCount, const vk::VkPushConstantRange* const pcRanges)
{
	m_pushConstantRanges.clear();
	for (deUint32 i = 0; i < rangeCount; ++i)
	{
		m_pushConstantRanges.push_back(pcRanges[i]);
	}
}